

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall Dice::addDiceValuesToResolvedHand(Dice *this)

{
  int iVar1;
  mapped_type *pmVar2;
  key_type local_40 [12];
  Dice *local_10;
  Dice *this_local;
  
  local_40[0xb] = 1;
  local_10 = this;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_40 + 0xb);
  iVar1 = *pmVar2;
  local_40[10] = 1;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_40 + 10);
  *pmVar2 = iVar1 + *pmVar2;
  local_40[9] = 3;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_40 + 9);
  iVar1 = *pmVar2;
  local_40[8] = 3;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_40 + 8);
  *pmVar2 = iVar1 + *pmVar2;
  local_40[7] = 0;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_40 + 7);
  iVar1 = *pmVar2;
  local_40[6] = 0;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_40 + 6);
  *pmVar2 = iVar1 + *pmVar2;
  local_40[5] = 5;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_40 + 5);
  iVar1 = *pmVar2;
  local_40[4] = 5;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_40 + 4);
  *pmVar2 = iVar1 + *pmVar2;
  local_40[3] = 2;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_40 + 3);
  iVar1 = *pmVar2;
  local_40[2] = 2;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_40 + 2);
  *pmVar2 = iVar1 + *pmVar2;
  local_40[1] = 4;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->DiceValues,local_40 + 1);
  iVar1 = *pmVar2;
  local_40[0] = Celebrity;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](&this->resolvedHand,local_40);
  *pmVar2 = iVar1 + *pmVar2;
  return;
}

Assistant:

void Dice::addDiceValuesToResolvedHand() {
    resolvedHand[DiceOptions::Attack] += DiceValues[DiceOptions::Attack];
    resolvedHand[DiceOptions::Heal] += DiceValues[DiceOptions::Heal];
    resolvedHand[DiceOptions::Energy] += DiceValues[DiceOptions::Energy];
    resolvedHand[DiceOptions::Ouch] += DiceValues[DiceOptions::Ouch];
    resolvedHand[DiceOptions::Destruction] += DiceValues[DiceOptions::Destruction];
    resolvedHand[DiceOptions::Celebrity] += DiceValues[DiceOptions::Celebrity];

}